

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_0::areCaseParamFlagsValid(ParamFlags flags)

{
  bool local_15;
  ParamFlags switchAll;
  ParamFlags flags_local;
  
  if ((flags & PARAMFLAGS_INIT_SINGLE) == 0) {
    switchAll._3_1_ = 1;
  }
  else {
    local_15 = (flags & (PARAMFLAGS_SWITCH_VERTEX|PARAMFLAGS_SWITCH_FRAGMENT)) == 0 ||
               (flags & (PARAMFLAGS_SWITCH_VERTEX|PARAMFLAGS_SWITCH_FRAGMENT)) ==
               (PARAMFLAGS_SWITCH_VERTEX|PARAMFLAGS_SWITCH_FRAGMENT);
    switchAll._3_1_ = local_15;
  }
  return (bool)switchAll._3_1_;
}

Assistant:

bool areCaseParamFlagsValid (ParamFlags flags)
{
	const ParamFlags switchAll = ParamFlags(PARAMFLAGS_SWITCH_VERTEX|PARAMFLAGS_SWITCH_FRAGMENT);

	if ((flags & PARAMFLAGS_INIT_SINGLE) != 0)
		return (flags & switchAll) == 0 ||
			   (flags & switchAll) == switchAll;
	else
		return true;
}